

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::IsInstrInvalidForMemOp(GlobOpt *this,Instr *instr,Loop *loop,Value *src1Val,Value *src2Val)

{
  BasicBlock *pBVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  OpLayoutType OVar5;
  BasicBlock *pBVar6;
  JITTimeFunctionBody *pJVar7;
  char16 *pcVar8;
  char16 *pcVar9;
  BranchInstr *this_00;
  uint uVar10;
  char16_t *form;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  pBVar1 = this->currentBlock;
  pBVar6 = Loop::GetHeadBlock(loop);
  if ((((pBVar1 != pBVar6) && (instr->m_kind != InstrKindLabel)) &&
      (instr->m_kind != InstrKindProfiledLabel)) && (bVar2 = IR::Instr::IsRealInstr(instr), bVar2))
  {
    uVar10 = instr->m_opcode - 0x1e4;
    if (((0x29 < uVar10) || ((0x30000000001U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) &&
       (instr->m_opcode != Ld_A)) {
      if (instr->m_kind == InstrKindBranch) {
        this_00 = IR::Instr::AsBranchInstr(instr);
        bVar2 = IR::BranchInstr::IsUnconditional(this_00);
        if (bVar2) goto LAB_0042429d;
      }
      if (DAT_0145948a != '\x01') {
        return true;
      }
      uVar3 = Func::GetSourceContextId(this->func);
      uVar4 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar3,uVar4);
      if (!bVar2) {
        uVar3 = Func::GetSourceContextId(this->func);
        uVar4 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar3,uVar4);
        if (!bVar2) {
          uVar3 = Func::GetSourceContextId(this->func);
          uVar4 = Func::GetLocalFunctionId(this->func);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar3,uVar4);
          if (!bVar2) {
            return true;
          }
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar7 = Func::GetJITFunctionBody(this->func);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
      pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_98);
      uVar3 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar3);
      form = L"Instruction not accepted for memop";
      goto LAB_0042467d;
    }
  }
LAB_0042429d:
  bVar2 = OpCodeAttr::FastFldInstr(instr->m_opcode);
  if ((bVar2) ||
     ((instr->m_prev != (Instr *)0x0 &&
      (bVar2 = OpCodeAttr::FastFldInstr(instr->m_prev->m_opcode), bVar2)))) {
    if (DAT_0145948a != '\x01') {
      return true;
    }
    uVar3 = Func::GetSourceContextId(this->func);
    uVar4 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar3,uVar4);
    if (!bVar2) {
      uVar3 = Func::GetSourceContextId(this->func);
      uVar4 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar3,uVar4);
      if (!bVar2) {
        uVar3 = Func::GetSourceContextId(this->func);
        uVar4 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar3,uVar4);
        if (!bVar2) {
          return true;
        }
      }
    }
    Output::Print(L"TRACE MemOp:");
    pJVar7 = Func::GetJITFunctionBody(this->func);
    pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
    pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_98);
    uVar3 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar3);
    form = L"Field interaction detected";
  }
  else {
    OVar5 = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
    if (OVar5._value == 0x3b) {
      if (DAT_0145948a != '\x01') {
        return true;
      }
      uVar3 = Func::GetSourceContextId(this->func);
      uVar4 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar3,uVar4);
      if (!bVar2) {
        uVar3 = Func::GetSourceContextId(this->func);
        uVar4 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar3,uVar4);
        if (!bVar2) {
          uVar3 = Func::GetSourceContextId(this->func);
          uVar4 = Func::GetLocalFunctionId(this->func);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar3,uVar4);
          if (!bVar2) {
            return true;
          }
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar7 = Func::GetJITFunctionBody(this->func);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
      pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_98);
      uVar3 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar3);
      form = L"Slot interaction detected";
    }
    else {
      bVar2 = MayNeedBailOnImplicitCall(instr,src1Val,src2Val);
      if (!bVar2) {
        return false;
      }
      if (DAT_0145948a != '\x01') {
        return true;
      }
      uVar3 = Func::GetSourceContextId(this->func);
      uVar4 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar3,uVar4);
      if (!bVar2) {
        uVar3 = Func::GetSourceContextId(this->func);
        uVar4 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar3,uVar4);
        if (!bVar2) {
          uVar3 = Func::GetSourceContextId(this->func);
          uVar4 = Func::GetLocalFunctionId(this->func);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar3,uVar4);
          if (!bVar2) {
            return true;
          }
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar7 = Func::GetJITFunctionBody(this->func);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
      pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_98);
      uVar3 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar3);
      form = L"Implicit call bailout detected";
    }
  }
LAB_0042467d:
  Output::Print(form);
  IR::Instr::DumpByteCodeOffset(instr);
  pcVar8 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L" (%s)",pcVar8);
  Output::Print(L"\n");
  Output::Flush();
  return true;
}

Assistant:

bool
GlobOpt::IsInstrInvalidForMemOp(IR::Instr *instr, Loop *loop, Value *src1Val, Value *src2Val)
{
    // List of instruction that are valid with memop (ie: instr that gets removed if memop is emitted)
    if (
        this->currentBlock != loop->GetHeadBlock() &&
        !instr->IsLabelInstr() &&
        instr->IsRealInstr() &&
        instr->m_opcode != Js::OpCode::IncrLoopBodyCount &&
        instr->m_opcode != Js::OpCode::StLoopBodyCount &&
        instr->m_opcode != Js::OpCode::Ld_A &&
        instr->m_opcode != Js::OpCode::Ld_I4 &&
        !(instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional())
    )
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Instruction not accepted for memop"));
        return true;
    }

    // Check prev instr because it could have been added by an optimization and we won't see it here.
    if (OpCodeAttr::FastFldInstr(instr->m_opcode) || (instr->m_prev && OpCodeAttr::FastFldInstr(instr->m_prev->m_opcode)))
    {
        // Refuse any operations interacting with Fields
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Field interaction detected"));
        return true;
    }

    if (Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::ElementSlot)
    {
        // Refuse any operations interacting with slots
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Slot interaction detected"));
        return true;
    }

    if (this->MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Implicit call bailout detected"));
        return true;
    }

    return false;
}